

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  anon_enum_32 aVar1;
  size_t sVar2;
  archive *a;
  uint uVar3;
  int iVar4;
  size_t code;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ZSTD_inBuffer in;
  
  in.pos = 0;
  output = &data->out;
  sVar7 = (data->out).pos;
  in.src = src;
  in.size = length;
  do {
    sVar2 = in.pos;
    aVar1 = data->state;
    if (aVar1 == resetting) {
      ZSTD_CCtx_reset(data->cstream,ZSTD_reset_session_only);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar1 == finishing) {
      code = ZSTD_endStream(data->cstream,output);
      uVar3 = ZSTD_isError(code);
      if (uVar3 != 0) {
LAB_005435c1:
        a = f->archive;
        pcVar5 = ZSTD_getErrorName(code);
        archive_set_error(a,-1,"Zstd compression failed: %s",pcVar5);
        return -0x1e;
      }
      if (code == 0) {
        data->state = resetting;
      }
    }
    else if (aVar1 == running) {
      if (in.pos == in.size) {
        return 0;
      }
      code = ZSTD_compressStream(data->cstream,output,&in);
      uVar3 = ZSTD_isError(code);
      if (uVar3 != 0) goto LAB_005435c1;
    }
    data->total_in = data->total_in + (in.pos - sVar2);
    uVar6 = (in.pos - sVar2) + data->cur_frame_in;
    data->cur_frame_in = uVar6;
    sVar2 = (data->out).pos;
    data->cur_frame_out = data->cur_frame_out + (sVar2 - sVar7);
    if ((data->state == running) && (data->max_frame_size <= uVar6)) {
      data->state = finishing;
    }
    if ((sVar2 == (data->out).size) || (sVar7 = sVar2, flush != 0 && sVar2 != 0)) {
      iVar4 = __archive_write_filter(f->next_filter,output->dst,sVar2);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
      sVar7 = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int flush, const void *src, size_t length)
{
	ZSTD_inBuffer in = { .src = src, .size = length, .pos = 0 };
	size_t ipos, opos, zstdret = 0;
	int ret;

	for (;;) {
		ipos = in.pos;
		opos = data->out.pos;
		switch (data->state) {
		case running:
			if (in.pos == in.size)
				return (ARCHIVE_OK);
			zstdret = ZSTD_compressStream(data->cstream,
			    &data->out, &in);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			break;
		case finishing:
			zstdret = ZSTD_endStream(data->cstream, &data->out);
			if (ZSTD_isError(zstdret))
				goto zstd_fatal;
			if (zstdret == 0)
				data->state = resetting;
			break;
		case resetting:
			ZSTD_CCtx_reset(data->cstream, ZSTD_reset_session_only);
			data->cur_frame++;
			data->cur_frame_in = 0;
			data->cur_frame_out = 0;
			data->state = running;
			break;
		}
		data->total_in += in.pos - ipos;
		data->cur_frame_in += in.pos - ipos;
		data->cur_frame_out += data->out.pos - opos;
		if (data->state == running &&
		    data->cur_frame_in >= data->max_frame_size) {
			data->state = finishing;
		}
		if (data->out.pos == data->out.size ||
		    (flush && data->out.pos > 0)) {
			ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.pos);
			if (ret != ARCHIVE_OK)
				goto fatal;
			data->out.pos = 0;
		}
	}
zstd_fatal:
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Zstd compression failed: %s",
	    ZSTD_getErrorName(zstdret));
fatal:
	return (ARCHIVE_FATAL);
}